

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * whereTempTriggers(Parse *pParse,Table *pTab)

{
  sqlite3 *db_00;
  Schema *pSVar1;
  char *zNew;
  sqlite3 *db;
  Schema *pTempSchema;
  char *zWhere;
  Trigger *pTrig;
  Table *pTab_local;
  Parse *pParse_local;
  
  pTempSchema = (Schema *)0x0;
  pSVar1 = pParse->db->aDb[1].pSchema;
  if (pTab->pSchema != pSVar1) {
    db_00 = pParse->db;
    for (zWhere = (char *)sqlite3TriggerList(pParse,pTab); zWhere != (char *)0x0;
        zWhere = *(char **)(zWhere + 0x40)) {
      if (*(Schema **)(zWhere + 0x28) == pSVar1) {
        pTempSchema = (Schema *)whereOrName(db_00,(char *)pTempSchema,*(char **)zWhere);
      }
    }
  }
  if (pTempSchema != (Schema *)0x0) {
    pSVar1 = (Schema *)sqlite3MPrintf(pParse->db,"type=\'trigger\' AND (%s)",pTempSchema);
    sqlite3DbFree(pParse->db,pTempSchema);
    pTempSchema = pSVar1;
  }
  return (char *)pTempSchema;
}

Assistant:

static char *whereTempTriggers(Parse *pParse, Table *pTab){
  Trigger *pTrig;
  char *zWhere = 0;
  const Schema *pTempSchema = pParse->db->aDb[1].pSchema; /* Temp db schema */

  /* If the table is not located in the temp-db (in which case NULL is 
  ** returned, loop through the tables list of triggers. For each trigger
  ** that is not part of the temp-db schema, add a clause to the WHERE 
  ** expression being built up in zWhere.
  */
  if( pTab->pSchema!=pTempSchema ){
    sqlite3 *db = pParse->db;
    for(pTrig=sqlite3TriggerList(pParse, pTab); pTrig; pTrig=pTrig->pNext){
      if( pTrig->pSchema==pTempSchema ){
        zWhere = whereOrName(db, zWhere, pTrig->zName);
      }
    }
  }
  if( zWhere ){
    char *zNew = sqlite3MPrintf(pParse->db, "type='trigger' AND (%s)", zWhere);
    sqlite3DbFree(pParse->db, zWhere);
    zWhere = zNew;
  }
  return zWhere;
}